

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::AlreadyConnectedToAddress(CConnman *this,CAddress *addr)

{
  CNode *pCVar1;
  long in_FS_OFFSET;
  bool bVar2;
  string sStack_68;
  CNetAddr local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&local_48,(CNetAddr *)addr);
  pCVar1 = FindNode(this,&local_48);
  bVar2 = true;
  if (pCVar1 == (CNode *)0x0) {
    CService::ToStringAddrPort_abi_cxx11_(&sStack_68,&addr->super_CService);
    pCVar1 = FindNode(this,&sStack_68);
    bVar2 = pCVar1 != (CNode *)0x0;
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_48.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::AlreadyConnectedToAddress(const CAddress& addr)
{
    return FindNode(static_cast<CNetAddr>(addr)) || FindNode(addr.ToStringAddrPort());
}